

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

FIOBJ http_mimetype_find2(FIOBJ url)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long *in_FS_OFFSET;
  ulong local_58;
  size_t i;
  undefined1 local_48 [7];
  uint8_t steps;
  fio_str_info_s tmp;
  FIOBJ mimetype;
  fio_str_info_s ext;
  FIOBJ url_local;
  
  ext.data = (char *)url;
  memset(&mimetype,0,0x18);
  if (ext.data != (char *)0x0) {
    fiobj_obj2cstr((fio_str_info_s *)local_48,(FIOBJ)ext.data);
    for (i._7_1_ = 1; i._7_1_ < tmp.capa || 0xe < i._7_1_; i._7_1_ = i._7_1_ + 1) {
      cVar1 = *(char *)(tmp.len + (tmp.capa - i._7_1_));
      if (cVar1 == '.') {
        bVar2 = i._7_1_ - 1;
        if (bVar2 != 0) {
          ext.capa = (size_t)bVar2;
          ext.len = *in_FS_OFFSET - 0x10;
          *(undefined1 *)(*in_FS_OFFSET + -0x10 + (ulong)bVar2) = 0;
          for (local_58 = 1; local_58 <= bVar2; local_58 = local_58 + 1) {
            iVar3 = tolower((int)*(char *)(tmp.len + (tmp.capa - local_58)));
            *(char *)(*in_FS_OFFSET + -0x10 + (bVar2 - local_58)) = (char)iVar3;
          }
        }
        break;
      }
      if (cVar1 == '/') break;
    }
  }
  tmp.data = (char *)http_mimetype_find((char *)ext.len,ext.capa);
  if (tmp.data == (char *)0x0) {
    tmp.data = (char *)fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  }
  return (FIOBJ)tmp.data;
}

Assistant:

FIOBJ http_mimetype_find2(FIOBJ url) {
  static __thread char buffer[LONGEST_FILE_EXTENSION_LENGTH + 1];
  fio_str_info_s ext = {.data = NULL};
  FIOBJ mimetype;
  if (!url)
    goto finish;
  fio_str_info_s tmp = fiobj_obj2cstr(url);
  uint8_t steps = 1;
  while (tmp.len > steps || steps >= LONGEST_FILE_EXTENSION_LENGTH) {
    switch (tmp.data[tmp.len - steps]) {
    case '.':
      --steps;
      if (steps) {
        ext.len = steps;
        ext.data = buffer;
        buffer[steps] = 0;
        for (size_t i = 1; i <= steps; ++i) {
          buffer[steps - i] = tolower(tmp.data[tmp.len - i]);
        }
      }
    /* fallthrough */
    case '/':
      goto finish;
      break;
    }
    ++steps;
  }
finish:
  mimetype = http_mimetype_find(ext.data, ext.len);
  if (!mimetype)
    mimetype = fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  return mimetype;
}